

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.h
# Opt level: O2

void embree::avx2::InstanceArrayIntersectorK<8>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive_conflict4 *prim)

{
  undefined1 auVar1 [32];
  int iVar2;
  undefined1 auVar3 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_60 [2];
  
  iVar2 = 1 << ((uint)k & 0x1f);
  auVar3._4_4_ = iVar2;
  auVar3._0_4_ = iVar2;
  auVar3._8_4_ = iVar2;
  auVar3._12_4_ = iVar2;
  auVar3._16_4_ = iVar2;
  auVar3._20_4_ = iVar2;
  auVar3._24_4_ = iVar2;
  auVar3._28_4_ = iVar2;
  auVar1 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar3 = vpand_avx2(auVar3,auVar1);
  local_60[0] = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)vpcmpeqd_avx2(auVar3,auVar1);
  intersect((vbool<8> *)&local_60[0].field_1,pre,ray,context,prim);
  return;
}

Assistant:

static __forceinline void intersect(Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& prim) {
        intersect(vbool<K>(1<<int(k)),pre,ray,context,prim);
      }